

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O3

void duckdb::ExecuteExpression
               (idx_t elem_cnt,ColumnInfo *column_info,
               vector<duckdb::LambdaFunctions::ColumnInfo,_true> *column_infos,Vector *index_vector,
               LambdaExecuteInfo *info)

{
  DataChunk *input;
  reference pvVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  Vector *other;
  pointer this;
  long lVar4;
  size_type __n;
  bool bVar5;
  vector<duckdb::Vector,_true> slices;
  Vector slice;
  idx_t local_c0;
  vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> local_b8;
  Vector local_98;
  
  input = &info->input_chunk;
  (info->input_chunk).count = elem_cnt;
  (info->lambda_chunk).count = elem_cnt;
  local_c0 = elem_cnt;
  Vector::Vector(&local_98,(column_info->vector)._M_data,&column_info->sel,elem_cnt);
  bVar5 = info->has_index == true;
  if (bVar5) {
    pvVar1 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    Vector::Reference(pvVar1,index_vector);
  }
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&input->data,(ulong)bVar5);
  Vector::Reference(pvVar1,&local_98);
  local_b8.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((column_infos->
      super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
      ).
      super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (column_infos->
      super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
      ).
      super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = (ulong)info->has_index + 1;
    __n = 0;
    do {
      pvVar2 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[](column_infos,__n);
      if (((pvVar2->vector)._M_data)->vector_type == CONSTANT_VECTOR) {
        pvVar1 = vector<duckdb::Vector,_true>::operator[](&input->data,lVar4 + __n);
        pvVar2 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[](column_infos,__n);
        other = (pvVar2->vector)._M_data;
      }
      else {
        pvVar2 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[](column_infos,__n);
        pvVar3 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[](column_infos,__n);
        ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
        emplace_back<std::reference_wrapper<duckdb::Vector>const&,duckdb::SelectionVector_const&,unsigned_long_const&>
                  ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&local_b8,
                   &pvVar2->vector,&pvVar3->sel,&local_c0);
        pvVar1 = vector<duckdb::Vector,_true>::operator[](&input->data,lVar4 + __n);
        other = vector<duckdb::Vector,_true>::back((vector<duckdb::Vector,_true> *)&local_b8);
      }
      Vector::Reference(pvVar1,other);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(column_infos->
                                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ).
                                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(column_infos->
                                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ).
                                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  this = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
         ::operator->(&info->expr_executor);
  ExpressionExecutor::Execute(this,input,&info->lambda_chunk);
  ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::~vector(&local_b8);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return;
}

Assistant:

void ExecuteExpression(const idx_t elem_cnt, const LambdaFunctions::ColumnInfo &column_info,
                       const vector<LambdaFunctions::ColumnInfo> &column_infos, const Vector &index_vector,
                       LambdaExecuteInfo &info) {

	info.input_chunk.SetCardinality(elem_cnt);
	info.lambda_chunk.SetCardinality(elem_cnt);

	// slice the child vector
	Vector slice(column_info.vector, column_info.sel, elem_cnt);

	// reference the child vector (and the index vector)
	if (info.has_index) {
		info.input_chunk.data[0].Reference(index_vector);
		info.input_chunk.data[1].Reference(slice);
	} else {
		info.input_chunk.data[0].Reference(slice);
	}
	idx_t slice_offset = info.has_index ? 2 : 1;

	// (slice and) reference the other columns
	vector<Vector> slices;
	for (idx_t i = 0; i < column_infos.size(); i++) {

		if (column_infos[i].vector.get().GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// only reference constant vectorsl
			info.input_chunk.data[i + slice_offset].Reference(column_infos[i].vector);

		} else {
			// slice inconstant vectors
			slices.emplace_back(column_infos[i].vector, column_infos[i].sel, elem_cnt);
			info.input_chunk.data[i + slice_offset].Reference(slices.back());
		}
	}

	// execute the lambda expression
	info.expr_executor->Execute(info.input_chunk, info.lambda_chunk);
}